

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleTypeHandler<3UL>::IsEnumerable
          (SimpleTypeHandler<3UL> *this,DynamicObject *instance,PropertyId propertyId)

{
  uint uVar1;
  uint uVar2;
  
  if (0 < this->propertyCount) {
    uVar1 = 1;
    do {
      uVar2 = uVar1 - 1 & 0xffff;
      if (*(int *)(*(long *)((long)&this->descriptors[0].Id.ptr + (ulong)(uVar2 << 4)) + 8) ==
          propertyId) {
        return *(byte *)((long)&this->descriptors[0].field_1 + (ulong)(uVar2 << 4)) & 1;
      }
      uVar2 = uVar1 & 0xffff;
      uVar1 = uVar1 + 1;
    } while (uVar2 < (uint)this->propertyCount);
  }
  return 1;
}

Assistant:

BOOL SimpleTypeHandler<size>::IsEnumerable(DynamicObject* instance, PropertyId propertyId)
    {
        PropertyIndex index;
        if (!GetDescriptor(propertyId, &index))
        {
            return true;
        }
        return descriptors[index].Attributes & PropertyEnumerable;
    }